

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O1

void __thiscall
KDReports::SpreadsheetReportLayout::paintIcon
          (SpreadsheetReportLayout *this,QPainter *painter,QRectF *cellContentsRect,
          QVariant *cellDecoration)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  QMetaType QVar5;
  int iVar6;
  QPixmap *pQVar7;
  PrivateShared *pPVar8;
  double dVar9;
  QIcon t_1;
  QPixmap pix;
  QImage img;
  QMetaType in_stack_ffffffffffffff38;
  QIcon local_c0 [2];
  undefined8 local_b0;
  QPixmap local_a8 [16];
  undefined8 local_98;
  QSize local_90 [2];
  undefined8 local_80;
  double local_78;
  code *local_70;
  double local_68;
  undefined8 local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar2 = operator==(in_stack_ffffffffffffff38,(QMetaType)0x152581);
  if (bVar2) {
    pQVar7 = (QPixmap *)cellDecoration;
    if (((cellDecoration->d).field_0x18 & 1) != 0) {
      pPVar8 = (cellDecoration->d).data.shared;
      pQVar7 = (QPixmap *)(pPVar8 + *(int *)(pPVar8 + 4));
    }
    QPixmap::QPixmap(local_a8,pQVar7);
  }
  else {
    QPixmap::QPixmap(local_a8);
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pPVar8 = (PrivateShared *)cellDecoration;
    if (((cellDecoration->d).field_0x18 & 1) != 0) {
      pPVar8 = (cellDecoration->d).data.shared;
      pPVar8 = pPVar8 + *(int *)(pPVar8 + 4);
    }
    QMetaType::convert(QVar5,pPVar8,(QMetaType)0x177010,local_a8);
  }
  cVar3 = QPixmap::isNull();
  if (cVar3 != '\0') {
    bVar2 = operator==(in_stack_ffffffffffffff38,(QMetaType)0x15260a);
    if (bVar2) {
      pPVar8 = (PrivateShared *)cellDecoration;
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar8 = (cellDecoration->d).data.shared;
        pPVar8 = pPVar8 + *(int *)(pPVar8 + 4);
      }
      QIcon::QIcon(local_c0,(QIcon *)pPVar8);
    }
    else {
      QIcon::QIcon(local_c0);
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      pPVar8 = (PrivateShared *)cellDecoration;
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar8 = (cellDecoration->d).data.shared;
        pPVar8 = pPVar8 + *(int *)(pPVar8 + 4);
      }
      QMetaType::convert(QVar5,pPVar8,(QMetaType)0x176fa0,local_c0);
    }
    QIcon::pixmap(local_90,(Mode)local_c0,(int)this + 0x88);
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
    uVar1 = local_80;
    local_60 = local_98;
    local_70 = QTextTableCell::firstCursorPosition;
    local_80 = 0;
    local_98 = uVar1;
    QPixmap::~QPixmap((QPixmap *)&local_70);
    QPixmap::~QPixmap((QPixmap *)local_90);
    QIcon::~QIcon(local_c0);
  }
  iVar4 = QPixmap::height();
  QImage::QImage((QImage *)local_90);
  cVar3 = QPixmap::isNull();
  if (cVar3 != '\0') {
    bVar2 = operator==(in_stack_ffffffffffffff38,(QMetaType)0x15271c);
    if (bVar2) {
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar8 = (cellDecoration->d).data.shared;
        cellDecoration = (QVariant *)(pPVar8 + *(int *)(pPVar8 + 4));
      }
      QImage::QImage((QImage *)local_c0,(QImage *)cellDecoration);
    }
    else {
      QImage::QImage((QImage *)local_c0);
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar8 = (cellDecoration->d).data.shared;
        cellDecoration = (QVariant *)(pPVar8 + *(int *)(pPVar8 + 4));
      }
      QMetaType::convert(QVar5,cellDecoration,(QMetaType)0x176f30,local_c0);
    }
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
    local_60 = local_80;
    local_80 = local_b0;
    local_70 = QTextCursor::blockFormat;
    local_b0 = 0;
    QImage::~QImage((QImage *)&local_70);
    QImage::~QImage((QImage *)local_c0);
    cVar3 = QImage::isNull();
    if (cVar3 != '\0') goto LAB_00152a31;
    iVar4 = QImage::height();
  }
  dVar9 = (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
  if ((dVar9 != 1.0) || (NAN(dVar9))) {
    cVar3 = QPixmap::isNull();
    if (cVar3 == '\0') {
      iVar4 = QPixmap::width();
      dVar9 = (double)iVar4 * (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
      QPixmap::scaledToWidth
                (local_c0,local_a8,
                 (int)((double)((ulong)dVar9 & 0x8000000000000000 | (ulong)DAT_001579c0) + dVar9),0)
      ;
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
      local_60 = local_98;
      local_98 = local_b0;
      local_70 = QTextTableCell::firstCursorPosition;
      local_b0 = 0;
      QPixmap::~QPixmap((QPixmap *)&local_70);
      QPixmap::~QPixmap((QPixmap *)local_c0);
      iVar4 = QPixmap::height();
    }
    else {
      iVar4 = QImage::width();
      dVar9 = (double)iVar4 * (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
      QImage::scaledToWidth
                (local_c0,local_90,
                 (int)((double)((ulong)dVar9 & 0x8000000000000000 | (ulong)DAT_001579c0) + dVar9),0)
      ;
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
      local_60 = local_80;
      local_80 = local_b0;
      local_70 = QTextCursor::blockFormat;
      local_b0 = 0;
      QImage::~QImage((QImage *)&local_70);
      QImage::~QImage((QImage *)local_c0);
      iVar4 = QImage::height();
    }
  }
  local_78 = cellContentsRect->h;
  local_48 = cellContentsRect->xp;
  uStack_40 = 0;
  local_58 = cellContentsRect->yp;
  uStack_50 = 0;
  cVar3 = QImage::isNull();
  iVar6 = (int)((local_78 - (double)iVar4) * 0.5);
  iVar4 = 0;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  local_70 = (code *)(double)(int)((double)((ulong)local_48 & 0x8000000000000000 |
                                           0x3fe0000000000000) + local_48);
  local_68 = (double)((int)((double)((ulong)local_58 & 0x8000000000000000 | 0x3fe0000000000000) +
                           local_58) + iVar4);
  if (cVar3 == '\0') {
    QPainter::drawImage((QPointF *)painter,(QImage *)&local_70);
  }
  else {
    QPainter::drawPixmap((QPointF *)painter,(QPixmap *)&local_70);
  }
LAB_00152a31:
  QImage::~QImage((QImage *)local_90);
  QPixmap::~QPixmap(local_a8);
  return;
}

Assistant:

void KDReports::SpreadsheetReportLayout::paintIcon(QPainter &painter, const QRectF &cellContentsRect, const QVariant &cellDecoration) const
{
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (pix.isNull()) {
        pix = qvariant_cast<QIcon>(cellDecoration).pixmap(m_tableLayout.m_iconSize);
    }
    qreal height = pix.height();
    QImage img;
    if (pix.isNull()) {
        img = qvariant_cast<QImage>(cellDecoration);
        if (img.isNull())
            return;
        height = img.height();
    }

    // Now either img or pix is set.

    // Apply scaling factor
    if (m_tableLayout.scalingFactor() != 1.) {
        if (!pix.isNull()) {
            pix = pix.scaledToWidth(qRound(pix.width() * m_tableLayout.scalingFactor()));
            height = pix.height();
        } else {
            img = img.scaledToWidth(qRound(img.width() * m_tableLayout.scalingFactor()));
            height = img.height();
        }
    }

    // Vertical centering
    const int y = qMax(0, int((cellContentsRect.height() - height) / 2.0));
    const QPoint topLeft = cellContentsRect.topLeft().toPoint() + QPoint(0, y);
    if (!img.isNull()) {
        // Draw img
        painter.drawImage(topLeft, img);
    } else {
        // Draw pix
        painter.drawPixmap(topLeft, pix);
    }
}